

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IndexTools.cpp
# Opt level: O0

vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *
IndexTools::CalculateStepSizeVector
          (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *nrElems)

{
  value_type vVar1;
  size_type sVar2;
  reference pvVar3;
  const_reference pvVar4;
  value_type vVar5;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_RSI;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_RDI;
  Index i;
  size_t vec_size;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *step_size;
  allocator_type *in_stack_ffffffffffffffa0;
  size_type in_stack_ffffffffffffffa8;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *this;
  undefined4 local_30;
  
  this = in_RDI;
  sVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size(in_RSI);
  std::allocator<unsigned_long_long>::allocator((allocator<unsigned_long_long> *)0xb0d128);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            (this,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::allocator<unsigned_long_long>::~allocator((allocator<unsigned_long_long> *)0xb0d148);
  pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                     (in_RDI,sVar2 - 1);
  *pvVar3 = 1;
  if (sVar2 != 1) {
    for (local_30 = (int)sVar2 - 2; local_30 != 0; local_30 = local_30 - 1) {
      pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         (in_RSI,(ulong)(local_30 + 1));
      vVar5 = *pvVar4;
      pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         (in_RDI,(ulong)(local_30 + 1));
      vVar5 = vVar5 * *pvVar3;
      pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                         (in_RDI,(ulong)local_30);
      *pvVar3 = vVar5;
    }
    pvVar4 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (in_RSI,1);
    vVar5 = *pvVar4;
    pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (in_RDI,1);
    vVar1 = *pvVar3;
    pvVar3 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                       (in_RDI,0);
    *pvVar3 = vVar5 * vVar1;
  }
  return this;
}

Assistant:

vector<LIndex> IndexTools::CalculateStepSizeVector(const vector<LIndex>& nrElems)
{
    size_t vec_size = nrElems.size();
    //increment indicates for each agent how many the joint index is
    //incremented to get the next individual action...
    vector<LIndex> step_size(vec_size);
    //the step_size for the last agent is 1
    step_size[vec_size-1] = 1;
    if(vec_size != 1)
    {
        Index i = vec_size-2;
        while(1)
        {
            if(i>0)
            {
                step_size[i] = nrElems[i+1] * step_size[i+1];
                i--;
            }
            else if(i==0)
            {
                step_size[i] = nrElems[i+1] * step_size[i+1];
                break;
            }
        }
    }
    return(step_size);
}